

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O3

region * __thiscall
toml::detail::sequence::scan(region *__return_storage_ptr__,sequence *this,location *loc)

{
  pointer psVar1;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var2;
  size_t sVar3;
  size_t sVar4;
  pointer psVar5;
  location first;
  region reg;
  location local_d8;
  region local_90;
  
  location::location(&local_d8,loc);
  psVar5 = (this->others_).
           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->others_).
           super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar1) {
    do {
      _Var2._M_head_impl =
           (psVar5->scanner_)._M_t.
           super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
           ._M_t.
           super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
           .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
      (*(_Var2._M_head_impl)->_vptr_scanner_base[2])(&local_90,_Var2._M_head_impl,loc);
      if (local_90.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        (loc->source_).
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_d8.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(loc->source_).
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,
                   &local_d8.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&loc->source_name_,&local_d8.source_name_);
        loc->column_number_ = local_d8.column_number_;
        loc->location_ = local_d8.location_;
        loc->line_number_ = local_d8.line_number_;
        region::region(__return_storage_ptr__);
        region::~region(&local_90);
        goto LAB_003516b1;
      }
      region::~region(&local_90);
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
  }
  (__return_storage_ptr__->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_d8.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  (__return_storage_ptr__->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_d8.source_.
       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_d8.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d8.source_.
       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_d8.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d8.source_.
       super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_d8.source_.
            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  (__return_storage_ptr__->source_name_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->source_name_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->source_name_,local_d8.source_name_._M_dataplus._M_p,
             local_d8.source_name_._M_dataplus._M_p + local_d8.source_name_._M_string_length);
  __return_storage_ptr__->first_ = local_d8.location_;
  __return_storage_ptr__->first_line_ = local_d8.line_number_;
  __return_storage_ptr__->first_column_ = local_d8.column_number_;
  sVar3 = loc->location_;
  sVar4 = loc->line_number_;
  __return_storage_ptr__->length_ = sVar3 - local_d8.location_;
  __return_storage_ptr__->last_ = sVar3;
  __return_storage_ptr__->last_line_ = sVar4;
  __return_storage_ptr__->last_column_ = loc->column_number_;
LAB_003516b1:
  location::~location(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE region sequence::scan(location& loc) const
{
    const auto first = loc;
    for(const auto& other : others_)
    {
        const auto reg = other.scan(loc);
        if( ! reg.is_ok())
        {
            loc = first;
            return region{};
        }
    }
    return region(first, loc);
}